

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::PerfectAggregateHashTable::AddChunk
          (PerfectAggregateHashTable *this,DataChunk *groups,DataChunk *payload)

{
  Vector *addresses;
  data_ptr_t __s;
  idx_t iVar1;
  long lVar2;
  data_ptr_t pdVar3;
  _Head_base<0UL,_bool_*,_false> _Var4;
  ulong params;
  byte bVar5;
  _Head_base<0UL,_duckdb::Vector_*,_false> _Var6;
  byte bVar7;
  int8_t iVar8;
  uint16_t uVar9;
  int16_t iVar10;
  uint32_t uVar11;
  int32_t iVar12;
  reference pvVar13;
  reference this_00;
  reference this_01;
  int64_t iVar14;
  uint64_t uVar15;
  TupleDataLayout *pTVar16;
  reference aggr;
  AggregateFilterData *filter_data;
  InvalidInputException *this_02;
  InternalException *this_03;
  idx_t iVar17;
  ulong uVar18;
  size_type __n;
  size_type __n_00;
  idx_t iVar19;
  idx_t iVar20;
  DataChunk *pDVar21;
  RowOperationsState row_state;
  undefined1 local_b8 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  TupleDataLayout *local_70;
  Aggregates *local_68;
  DataChunk *local_60;
  DataChunk *local_58;
  string local_50;
  
  __s = (this->addresses).data;
  local_60 = payload;
  switchD_0105dc25::default(__s,0,groups->count << 3);
  if ((groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (groups->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    iVar20 = this->total_required_bits;
    local_70 = (TupleDataLayout *)&this->required_bits;
    local_68 = (Aggregates *)&this->group_minima;
    __n = 0;
    local_58 = groups;
    do {
      pvVar13 = vector<unsigned_long,_true>::operator[]((vector<unsigned_long,_true> *)local_70,__n)
      ;
      iVar20 = iVar20 - *pvVar13;
      this_00 = vector<duckdb::Vector,_true>::operator[](&groups->data,__n);
      this_01 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)local_68,__n)
      ;
      iVar1 = groups->count;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_b8);
      Vector::ToUnifiedFormat(this_00,iVar1,(UnifiedVectorFormat *)local_b8);
      _Var6._M_head_impl = local_b0._M_head_impl;
      bVar5 = (byte)iVar20;
      switch((this_00->type).physical_type_) {
      case UINT8:
        bVar7 = Value::GetValueUnsafe<unsigned_char>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(ulong *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((ulong)(&(_Var6._M_head_impl)->vector_type)[iVar17] - (ulong)bVar7) + 1 <<
                   (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(ulong *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((ulong)(&(_Var6._M_head_impl)->vector_type)[iVar17] - (ulong)bVar7) + 1 <<
                   (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      case INT8:
        iVar8 = Value::GetValueUnsafe<signed_char>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((long)(char)(&(_Var6._M_head_impl)->vector_type)[iVar17] - (long)iVar8) + 1 <<
                   (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((long)(char)(&(_Var6._M_head_impl)->vector_type)[iVar17] - (long)iVar8) + 1 <<
                   (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      case UINT16:
        uVar9 = Value::GetValueUnsafe<unsigned_short>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(ulong *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((ulong)*(ushort *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 2) -
                    (ulong)uVar9) + 1 << (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(ulong *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((ulong)*(ushort *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 2) -
                    (ulong)uVar9) + 1 << (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      case INT16:
        iVar10 = Value::GetValueUnsafe<short>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((long)*(short *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 2) -
                    (long)iVar10) + 1 << (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   (((long)*(short *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 2) -
                    (long)iVar10) + 1 << (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      case UINT32:
        uVar11 = Value::GetValueUnsafe<unsigned_int>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(ulong *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((ulong)((*(int *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 4) - uVar11) + 1
                           ) << (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(ulong *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((ulong)((*(int *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 4) - uVar11) + 1
                           ) << (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      case INT32:
        iVar12 = Value::GetValueUnsafe<int>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((long)((*(int *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 4) - iVar12) + 1)
                   << (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((long)((*(int *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 4) - iVar12) + 1)
                   << (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      case UINT64:
        uVar15 = Value::GetValueUnsafe<unsigned_long>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(uint64_t *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((*(long *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 8) - uVar15) + 1 <<
                   (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(uint64_t *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((*(long *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 8) - uVar15) + 1 <<
                   (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      case INT64:
        iVar14 = Value::GetValueUnsafe<long>(this_01);
        if ((unsigned_long *)local_a8._M_allocated_capacity == (unsigned_long *)0x0) {
          if (iVar1 != 0) {
            lVar2 = *(long *)local_b8;
            iVar19 = 0;
            do {
              iVar17 = iVar19;
              if (lVar2 != 0) {
                iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
              }
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((*(long *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 8) - iVar14) + 1 <<
                   (bVar5 & 0x3f));
              iVar19 = iVar19 + 1;
            } while (iVar1 != iVar19);
          }
        }
        else if (iVar1 != 0) {
          lVar2 = *(long *)local_b8;
          iVar19 = 0;
          do {
            iVar17 = iVar19;
            if (lVar2 != 0) {
              iVar17 = (idx_t)*(uint *)(lVar2 + iVar19 * 4);
            }
            if ((*(ulong *)(local_a8._M_allocated_capacity + (iVar17 >> 6) * 8) >> (iVar17 & 0x3f) &
                1) != 0) {
              *(long *)(__s + iVar19 * 8) =
                   *(long *)(__s + iVar19 * 8) +
                   ((*(long *)(&(_Var6._M_head_impl)->vector_type + iVar17 * 8) - iVar14) + 1 <<
                   (bVar5 & 0x3f));
            }
            iVar19 = iVar19 + 1;
          } while (iVar1 != iVar19);
        }
        break;
      default:
        this_03 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Unsupported group type for perfect aggregate hash table","")
        ;
        InternalException::InternalException(this_03,&local_50);
        __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
      }
      groups = local_58;
      if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(groups->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(groups->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  if (groups->count != 0) {
    pdVar3 = this->data;
    _Var4._M_head_impl =
         (this->group_is_set).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    uVar18 = 0;
    do {
      params = *(ulong *)(__s + uVar18 * 8);
      if (this->total_groups <= params) {
        this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_b8 = (undefined1  [8])&local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,
                   "Perfect hash aggregate: aggregate group %llu exceeded total groups %llu. This likely means that the statistics in your data source are corrupt.\n* PRAGMA disable_optimizer to disable optimizations that rely on correct statistics"
                   ,"");
        InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                  (this_02,(string *)local_b8,params,this->total_groups);
        __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var4._M_head_impl[params] = true;
      *(data_ptr_t *)(__s + uVar18 * 8) = pdVar3 + params * this->tuple_size;
      uVar18 = uVar18 + 1;
    } while (uVar18 < groups->count);
  }
  pTVar16 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                      (&(this->super_BaseAggregateHashTable).layout_ptr);
  local_b8 = (undefined1  [8])
             unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
             operator*(&this->aggregate_allocator);
  local_b0._M_head_impl = (Vector *)0x0;
  local_70 = pTVar16;
  if ((pTVar16->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pTVar16->aggregates).
      super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
      super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    addresses = &this->addresses;
    local_68 = &pTVar16->aggregates;
    __n_00 = 0;
    iVar20 = 0;
    do {
      aggr = vector<duckdb::AggregateObject,_true>::operator[](local_68,__n_00);
      pDVar21 = local_60;
      iVar1 = aggr->child_count;
      if (aggr->filter == (Expression *)0x0) {
        RowOperations::UpdateStates
                  ((RowOperationsState *)local_b8,aggr,addresses,local_60,iVar20,local_60->count);
      }
      else {
        filter_data = AggregateFilterDataSet::GetFilterData
                                (&(this->super_BaseAggregateHashTable).filter_set,__n_00);
        pDVar21 = local_60;
        RowOperations::UpdateFilteredStates
                  ((RowOperationsState *)local_b8,filter_data,aggr,addresses,local_60,iVar20);
      }
      VectorOperations::AddInPlace(addresses,aggr->payload_size,pDVar21->count);
      iVar20 = iVar20 + iVar1;
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(local_70->aggregates).
                                     super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     .
                                     super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_70->aggregates).
                                     super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     .
                                     super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             0x2e8ba2e8ba2e8ba3));
  }
  if ((_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
      local_b0._M_head_impl != (Vector *)0x0) {
    ::std::default_delete<duckdb::Vector>::operator()
              ((default_delete<duckdb::Vector> *)&local_b0,local_b0._M_head_impl);
  }
  return;
}

Assistant:

void PerfectAggregateHashTable::AddChunk(DataChunk &groups, DataChunk &payload) {
	// first we need to find the location in the HT of each of the groups
	auto address_data = FlatVector::GetData<uintptr_t>(addresses);
	// zero-initialize the address data
	memset(address_data, 0, groups.size() * sizeof(uintptr_t));
	D_ASSERT(groups.ColumnCount() == group_minima.size());

	// then compute the actual group location by iterating over each of the groups
	idx_t current_shift = total_required_bits;
	for (idx_t i = 0; i < groups.ColumnCount(); i++) {
		current_shift -= required_bits[i];
		ComputeGroupLocation(groups.data[i], group_minima[i], address_data, current_shift, groups.size());
	}
	// now we have the HT entry number for every tuple
	// compute the actual pointer to the data by adding it to the base HT pointer and multiplying by the tuple size
	for (idx_t i = 0; i < groups.size(); i++) {
		const auto group = address_data[i];
		if (group >= total_groups) {
			throw InvalidInputException("Perfect hash aggregate: aggregate group %llu exceeded total groups %llu. This "
			                            "likely means that the statistics in your data source are corrupt.\n* PRAGMA "
			                            "disable_optimizer to disable optimizations that rely on correct statistics",
			                            group, total_groups);
		}
		group_is_set[group] = true;
		address_data[i] = uintptr_t(data) + group * tuple_size;
	}

	// after finding the group location we update the aggregates
	idx_t payload_idx = 0;
	auto &aggregates = layout_ptr->GetAggregates();
	RowOperationsState row_state(*aggregate_allocator);
	for (idx_t aggr_idx = 0; aggr_idx < aggregates.size(); aggr_idx++) {
		auto &aggregate = aggregates[aggr_idx];
		auto input_count = (idx_t)aggregate.child_count;
		if (aggregate.filter) {
			RowOperations::UpdateFilteredStates(row_state, filter_set.GetFilterData(aggr_idx), aggregate, addresses,
			                                    payload, payload_idx);
		} else {
			RowOperations::UpdateStates(row_state, aggregate, addresses, payload, payload_idx, payload.size());
		}
		// move to the next aggregate
		payload_idx += input_count;
		VectorOperations::AddInPlace(addresses, UnsafeNumericCast<int64_t>(aggregate.payload_size), payload.size());
	}
}